

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian_opt.cpp
# Opt level: O3

void compute_response_layer_precompute(response_layer *layer,integral_image *iimage)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  float *pfVar6;
  bool *pbVar7;
  float *pfVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  float *data;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  long lVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  undefined1 auVar59 [16];
  float fVar60;
  float fVar61;
  float fVar62;
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  undefined1 in_ZMM23 [64];
  undefined1 in_ZMM24 [64];
  
  iVar1 = layer->height;
  if (0 < iVar1) {
    pfVar6 = layer->response;
    iVar2 = layer->filter_size;
    auVar48 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
    pbVar7 = layer->laplacian;
    iVar38 = (iVar2 + -1) - (iVar2 + -1 >> 0x1f) >> 1;
    iVar3 = layer->step;
    iVar11 = iVar2 / 6;
    iVar12 = iVar2 >> 0x1f;
    fVar52 = 1.0 / (float)(iVar2 * iVar2);
    iVar4 = layer->width;
    iVar27 = 0;
    iVar13 = iVar2 / 3 + iVar12;
    iVar46 = iVar13 - iVar12;
    iVar21 = 0;
    do {
      if (0 < iVar4) {
        iVar22 = iVar21 * iVar3;
        iVar5 = iimage->height;
        iVar35 = iimage->data_width;
        pfVar8 = iimage->data;
        iVar37 = iVar22 - ((iVar13 + -1) - iVar12);
        iVar14 = iVar37;
        if (iVar5 < iVar37) {
          iVar14 = iVar5;
        }
        iVar37 = iVar37 + iVar46 * 2 + -1;
        if (iVar5 <= iVar37) {
          iVar37 = iVar5;
        }
        iVar28 = (iVar14 + -1) * iVar35;
        iVar39 = (iVar37 + -1) * iVar35;
        iVar29 = iVar22 - iVar38;
        iVar15 = iVar29;
        if (iVar5 < iVar29) {
          iVar15 = iVar5;
        }
        iVar16 = iVar29 + iVar2;
        if (iVar5 <= iVar29 + iVar2) {
          iVar16 = iVar5;
        }
        iVar40 = (iVar15 + -1) * iVar35;
        iVar30 = (iVar16 + -1) * iVar35;
        iVar31 = iVar22 - iVar11;
        iVar29 = iVar31;
        if (iVar5 < iVar31) {
          iVar29 = iVar5;
        }
        iVar17 = iVar31 + iVar46;
        if (iVar5 <= iVar31 + iVar46) {
          iVar17 = iVar5;
        }
        iVar41 = (iVar29 + -1) * iVar35;
        iVar32 = (iVar17 + -1) * iVar35;
        iVar31 = iVar22 - iVar46;
        if (iVar5 < iVar22 - iVar46) {
          iVar31 = iVar5;
        }
        iVar18 = iVar5;
        if (iVar22 < iVar5) {
          iVar18 = iVar22;
        }
        iVar33 = (iVar31 + -1) * iVar35;
        iVar34 = (iVar18 + -1) * iVar35;
        iVar23 = iVar22 + 1 + iVar46;
        iVar19 = iVar22 + 1;
        if (iVar5 < iVar22 + 1) {
          iVar19 = iVar5;
        }
        if (iVar23 < iVar5) {
          iVar5 = iVar23;
        }
        iVar45 = 0;
        lVar47 = 0;
        iVar23 = (iVar19 + -1) * iVar35;
        iVar35 = (iVar5 + -1) * iVar35;
        iVar22 = iimage->width;
        do {
          fVar53 = 0.0;
          fVar57 = 0.0;
          iVar26 = iVar45 - iVar38;
          if (iVar22 < iVar45 - iVar38) {
            iVar26 = iVar22;
          }
          iVar20 = (iVar2 - iVar38) + iVar45;
          if (iVar22 <= iVar20) {
            iVar20 = iVar22;
          }
          if ((0 < iVar14) && (0 < iVar26)) {
            fVar57 = pfVar8[iVar28 + iVar26 + -1];
          }
          if ((0 < iVar14) && (0 < iVar20)) {
            fVar53 = pfVar8[iVar28 + iVar20 + -1];
          }
          fVar55 = 0.0;
          fVar56 = 0.0;
          if ((0 < iVar37) && (0 < iVar26)) {
            fVar56 = pfVar8[iVar26 + -1 + iVar39];
          }
          if ((0 < iVar37) && (0 < iVar20)) {
            fVar55 = pfVar8[iVar20 + -1 + iVar39];
          }
          auVar59 = ZEXT816(0) << 0x40;
          fVar58 = 0.0;
          iVar26 = iVar45 - iVar11;
          if (iVar22 < iVar45 - iVar11) {
            iVar26 = iVar22;
          }
          iVar20 = (iVar46 - iVar11) + iVar45;
          if (iVar22 <= iVar20) {
            iVar20 = iVar22;
          }
          if ((0 < iVar14) && (0 < iVar26)) {
            fVar58 = pfVar8[iVar28 + iVar26 + -1];
          }
          fVar60 = 0.0;
          if ((0 < iVar14) && (0 < iVar20)) {
            fVar60 = pfVar8[iVar28 + iVar20 + -1];
          }
          fVar61 = 0.0;
          fVar62 = 0.0;
          if ((0 < iVar37) && (0 < iVar26)) {
            fVar62 = pfVar8[iVar26 + -1 + iVar39];
          }
          if ((0 < iVar37) && (0 < iVar20)) {
            fVar61 = pfVar8[iVar20 + -1 + iVar39];
          }
          iVar26 = -iVar46 + 1 + iVar45;
          fVar54 = 0.0;
          if (iVar22 < iVar26) {
            iVar26 = iVar22;
          }
          iVar20 = iVar46 + iVar45;
          if (iVar22 <= iVar46 + iVar45) {
            iVar20 = iVar22;
          }
          iVar42 = iVar26 + -1;
          auVar9 = vmaxss_avx(ZEXT416((uint)(((fVar57 - fVar53) - fVar56) + fVar55)),auVar59);
          auVar49 = vmaxss_avx(ZEXT416((uint)(fVar61 + ((fVar58 - fVar60) - fVar62))),
                               ZEXT816(0) << 0x40);
          auVar9 = vfmadd132ss_fma(auVar49,auVar9,SUB6416(ZEXT464(0xc0400000),0));
          fVar57 = 0.0;
          if ((0 < iVar15) && (0 < iVar26)) {
            fVar57 = pfVar8[iVar40 + iVar42];
          }
          iVar24 = iVar20 + -1;
          if ((0 < iVar15) && (0 < iVar20)) {
            fVar54 = pfVar8[iVar40 + iVar24];
          }
          fVar56 = 0.0;
          fVar53 = 0.0;
          if ((0 < iVar16) && (0 < iVar26)) {
            fVar53 = pfVar8[iVar30 + iVar42];
          }
          if ((0 < iVar16) && (0 < iVar20)) {
            fVar56 = pfVar8[iVar30 + iVar24];
          }
          if ((0 < iVar29) && (0 < iVar26)) {
            auVar59 = ZEXT416((uint)pfVar8[iVar41 + iVar42]);
          }
          fVar55 = 0.0;
          if ((0 < iVar29) && (0 < iVar20)) {
            fVar55 = pfVar8[iVar41 + iVar24];
          }
          fVar60 = 0.0;
          fVar58 = 0.0;
          if ((0 < iVar17) && (0 < iVar26)) {
            fVar58 = pfVar8[iVar42 + iVar32];
          }
          if ((0 < iVar17) && (0 < iVar20)) {
            fVar60 = pfVar8[iVar24 + iVar32];
          }
          iVar20 = iVar45 + 1 + iVar46;
          fVar62 = 0.0;
          iVar26 = iVar45 + 1;
          if (iVar22 < iVar45 + 1) {
            iVar26 = iVar22;
          }
          if (iVar22 <= iVar20) {
            iVar20 = iVar22;
          }
          iVar42 = iVar26 + -1;
          auVar49 = vmaxss_avx(ZEXT416((uint)(((fVar57 - fVar54) - fVar53) + fVar56)),
                               ZEXT816(0) << 0x40);
          auVar59 = vmaxss_avx(ZEXT416((uint)(fVar60 + ((auVar59._0_4_ - fVar55) - fVar58))),
                               ZEXT816(0) << 0x40);
          auVar59 = vfmadd132ss_fma(auVar59,auVar49,SUB6416(ZEXT464(0xc0400000),0));
          fVar57 = 0.0;
          if ((0 < iVar31) && (0 < iVar26)) {
            fVar57 = pfVar8[iVar33 + iVar42];
          }
          iVar24 = iVar20 + -1;
          if ((0 < iVar31) && (0 < iVar20)) {
            fVar62 = pfVar8[iVar33 + iVar24];
          }
          fVar56 = 0.0;
          fVar53 = 0.0;
          if (0 < iVar18 && 0 < iVar26) {
            fVar53 = pfVar8[iVar34 + iVar42];
          }
          if ((0 < iVar18) && (0 < iVar20)) {
            fVar56 = pfVar8[iVar34 + iVar24];
          }
          iVar43 = -iVar46 + iVar45;
          fVar55 = 0.0;
          if (iVar22 < iVar43) {
            iVar43 = iVar22;
          }
          iVar36 = iVar22;
          if (iVar45 < iVar22) {
            iVar36 = iVar45;
          }
          iVar25 = iVar43 + -1;
          if ((0 < iVar19) && (0 < iVar43)) {
            fVar55 = pfVar8[iVar23 + iVar25];
          }
          iVar44 = iVar36 + -1;
          fVar58 = 0.0;
          if ((0 < iVar19) && (0 < iVar36)) {
            fVar58 = pfVar8[iVar23 + iVar44];
          }
          fVar61 = 0.0;
          fVar60 = 0.0;
          if ((0 < iVar5) && (0 < iVar43)) {
            fVar60 = pfVar8[iVar35 + iVar25];
          }
          if ((0 < iVar5) && (0 < iVar36)) {
            fVar61 = pfVar8[iVar35 + iVar44];
          }
          auVar49 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
          in_ZMM16 = ZEXT1664(auVar49);
          if ((0 < iVar31) && (0 < iVar43)) {
            in_ZMM16 = ZEXT464((uint)pfVar8[iVar33 + iVar25]);
          }
          auVar49 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
          in_ZMM17 = ZEXT1664(auVar49);
          if ((0 < iVar31) && (0 < iVar36)) {
            in_ZMM17 = ZEXT464((uint)pfVar8[iVar33 + iVar44]);
          }
          auVar49 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
          in_ZMM18 = ZEXT1664(auVar49);
          auVar49 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
          in_ZMM19 = ZEXT1664(auVar49);
          if ((0 < iVar18) && (0 < iVar43)) {
            in_ZMM19 = ZEXT464((uint)pfVar8[iVar25 + iVar34]);
          }
          if (0 < iVar18 && 0 < iVar36) {
            in_ZMM18 = ZEXT464((uint)pfVar8[iVar44 + iVar34]);
          }
          auVar49 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
          in_ZMM21 = ZEXT1664(auVar49);
          if ((0 < iVar19) && (0 < iVar26)) {
            in_ZMM21 = ZEXT464((uint)pfVar8[iVar23 + iVar42]);
          }
          auVar49 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
          in_ZMM22 = ZEXT1664(auVar49);
          if ((0 < iVar19) && (0 < iVar20)) {
            in_ZMM22 = ZEXT464((uint)pfVar8[iVar23 + iVar24]);
          }
          auVar49 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
          in_ZMM23 = ZEXT1664(auVar49);
          auVar49 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
          in_ZMM24 = ZEXT1664(auVar49);
          if ((0 < iVar5) && (0 < iVar26)) {
            in_ZMM24 = ZEXT464((uint)pfVar8[iVar42 + iVar35]);
          }
          if ((0 < iVar5) && (0 < iVar20)) {
            in_ZMM23 = ZEXT464((uint)pfVar8[iVar24 + iVar35]);
          }
          auVar49 = vmaxss_avx(ZEXT416((uint)(fVar56 + ((fVar57 - fVar62) - fVar53))),
                               ZEXT816(0) << 0x40);
          auVar10 = vmaxss_avx(ZEXT416((uint)(fVar61 + ((fVar55 - fVar58) - fVar60))),
                               ZEXT816(0) << 0x40);
          auVar50 = vsubss_avx512f(in_ZMM16._0_16_,in_ZMM17._0_16_);
          auVar50 = vsubss_avx512f(auVar50,in_ZMM19._0_16_);
          auVar50 = vaddss_avx512f(auVar50,in_ZMM18._0_16_);
          auVar51 = vmaxss_avx512f(auVar50,auVar48);
          auVar50 = vsubss_avx512f(in_ZMM21._0_16_,in_ZMM22._0_16_);
          auVar50 = vsubss_avx512f(auVar50,in_ZMM24._0_16_);
          auVar50 = vaddss_avx512f(auVar50,in_ZMM23._0_16_);
          auVar50 = vmaxss_avx(auVar50,ZEXT816(0) << 0x40);
          fVar57 = ((auVar49._0_4_ + auVar10._0_4_) - auVar51._0_4_) - auVar50._0_4_;
          auVar49 = vfmadd231ss_fma(ZEXT416((uint)(fVar57 * fVar57 * -0.81)),auVar9,auVar59);
          pfVar6[iVar27 + lVar47] = fVar52 * fVar52 * auVar49._0_4_;
          pbVar7[lVar47 + iVar27] = 0.0 <= auVar9._0_4_ + auVar59._0_4_;
          iVar45 = iVar45 + iVar3;
          lVar47 = lVar47 + 1;
        } while (iVar4 != (int)lVar47);
        iVar27 = iVar27 + (int)lVar47;
      }
      iVar21 = iVar21 + 1;
    } while (iVar21 != iVar1);
  }
  return;
}

Assistant:

void compute_response_layer_precompute(struct response_layer* layer, struct integral_image* iimage) {
    /*
    optimizations:
        - simplifying normalization and precomputing inv_area_square => -2 flops per loop iteration
        - precomputation of indices
    */

    float Dxx, Dyy, Dxy;
    int x, y;

    float* response = layer->response;
    bool* laplacian = layer->laplacian;

    int step = layer->step;
    int filter_size = layer->filter_size;
    int height = layer->height;
    int width = layer->width;

    int lobe = filter_size/3;
    int border = (filter_size-1)/2;
    float inv_area = 1.f/(filter_size*filter_size);

    float inv_area_square = inv_area*inv_area;

    int lobe_div_2 = lobe / 2;
    int lobe_sub_1 = lobe - 1;
    int lobe_mul_2_sub_1 = 2*lobe - 1;

    for (int i = 0, ind = 0; i < height; ++i) {
        x = i*step;
        for (int j = 0; j < width; ++j, ind++) {
            y = j*step;

            // // Calculate Dxx, Dyy, Dxy with Box Filter
            Dxx = box_integral(iimage, x - lobe_sub_1, y - border, lobe_mul_2_sub_1, filter_size)
                    - 3 * box_integral(iimage, x - lobe_sub_1, y - lobe_div_2, lobe_mul_2_sub_1, lobe);
            Dyy = box_integral(iimage, x - border, y - lobe_sub_1, filter_size, lobe_mul_2_sub_1)
                    - 3 * box_integral(iimage, x - lobe_div_2, y - lobe_sub_1, lobe, lobe_mul_2_sub_1);

            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe)
                    + box_integral(iimage, x + 1, y - lobe, lobe, lobe)
                    - box_integral(iimage, x - lobe, y - lobe, lobe, lobe)
                    - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Calculate Determinant & normalize
            response[ind] = inv_area_square*(Dxx * Dyy - 0.81f * Dxy * Dxy);

            // Calculate Laplacian (scaling does not matter as rescaling both summands keeps the sign)
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
        }
    }

}